

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool DynamicProfileStorage::LoadCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  undefined1 local_78 [8];
  StorageInfo newInfo;
  StorageInfo *oldInfo;
  char16 *url;
  uint local_50;
  DWORD len;
  DWORD i;
  DWORD start;
  uint local_38;
  uint local_34;
  DWORD time;
  DWORD count;
  DWORD version;
  DWORD magic;
  DynamicProfileStorageReaderWriter catalogFile;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x380,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((useCacheDir & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x381,"(useCacheDir)","useCacheDir");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((locked & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x382,"(locked)","locked");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DynamicProfileStorageReaderWriter::DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)&version);
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)&version,catalogFilename,L"rb",false,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)&version,&count);
    if (((((bVar2) &&
          (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                             ((DynamicProfileStorageReaderWriter *)&version,&time), bVar2)) &&
         (bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)&version,&local_38), bVar2)) &&
        ((bVar2 = DynamicProfileStorageReaderWriter::Read<unsigned_int>
                            ((DynamicProfileStorageReaderWriter *)&version,&local_34), bVar2 &&
         (count == 0x132b5ae)))) && (1 < time)) {
      if (time < 3) {
        len = 0;
        if ((useCacheDir & 1U) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x3a8,"(useCacheDir)","useCacheDir");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if ((ulong)local_38 == creationTime) {
          len = JsUtil::
                BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                ::Count(&infoMap);
          if (local_34 < len) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x3ad,"(count >= start)","count >= start");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          iVar3 = DynamicProfileStorageReaderWriter::Size
                            ((DynamicProfileStorageReaderWriter *)&version);
          if (iVar3 < lastOffset) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                               ,0x3ae,"(catalogFile.Size() >= lastOffset)",
                               "catalogFile.Size() >= lastOffset");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          if (local_34 == nextFileId) {
            iVar3 = DynamicProfileStorageReaderWriter::Size
                              ((DynamicProfileStorageReaderWriter *)&version);
            if (iVar3 != lastOffset) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x3b1,"(catalogFile.Size() == lastOffset)",
                                 "catalogFile.Size() == lastOffset");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
            catalogFile._23_1_ = 1;
            goto LAB_00dbbeeb;
          }
          bVar2 = DynamicProfileStorageReaderWriter::Seek
                            ((DynamicProfileStorageReaderWriter *)&version,lastOffset);
          if (!bVar2) {
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)&version,false);
            Output::Print(L"ERROR: DynamicProfileStorage: Unable to seek to last known offset\n");
            Output::Flush();
            catalogFile._23_1_ = CreateCacheCatalog();
            goto LAB_00dbbeeb;
          }
        }
        else if (creationTime != 0) {
          Output::Print(L"WARNING: DynamicProfileStorage: Reloading full catalog\n");
          Output::Flush();
        }
        for (local_50 = len; local_50 < local_34; local_50 = local_50 + 1) {
          bVar2 = DynamicProfileStorageReaderWriter::ReadUtf8String
                            ((DynamicProfileStorageReaderWriter *)&version,(char16 **)&oldInfo,
                             (DWORD *)((long)&url + 4));
          if (!bVar2) {
            bVar2 = DoTrace();
            if (bVar2) {
              Output::Print(
                           L"TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: \'%s\'\n"
                           );
              Output::Flush();
            }
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)&version,false);
            catalogFile._23_1_ = CreateCacheCatalog();
            goto LAB_00dbbeeb;
          }
          bVar2 = JsUtil::
                  BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                  ::TryGetReference<char16_t*>
                            ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                              *)&infoMap,(char16_t **)&oldInfo,
                             (StorageInfo **)&newInfo.field_1.record);
          if (bVar2) {
            if ((*newInfo.field_1.record & 1U) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x3d8,"(oldInfo->isFileStorage)","oldInfo->isFileStorage");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
            *(uint *)(newInfo.field_1.record + 8) = local_50;
          }
          else {
            local_78[0] = true;
            newInfo._0_4_ = local_50;
            JsUtil::
            BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
            ::Add(&infoMap,(char16_t **)&oldInfo,(StorageInfo *)local_78);
          }
        }
        if ((creationTime == 0) && (bVar2 = DoTrace(), bVar2)) {
          Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog loaded: \'%s\'\n",
                        catalogFilename);
          Output::Flush();
        }
        nextFileId = local_34;
        creationTime = (TimeType)local_38;
        lastOffset = DynamicProfileStorageReaderWriter::Size
                               ((DynamicProfileStorageReaderWriter *)&version);
        catalogFile._23_1_ = 1;
      }
      else {
        DisableCacheDir();
        Output::Print(L"ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n")
        ;
        Output::Flush();
        catalogFile._23_1_ = 0;
      }
    }
    else {
      DynamicProfileStorageReaderWriter::Close((DynamicProfileStorageReaderWriter *)&version,false);
      bVar2 = DoTrace();
      if (bVar2) {
        Output::Print(L"TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: \'%s\'\n"
                      ,catalogFilename);
        Output::Flush();
      }
      catalogFile._23_1_ = CreateCacheCatalog();
    }
  }
  else {
    catalogFile._23_1_ = CreateCacheCatalog();
  }
LAB_00dbbeeb:
  i = 1;
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)&version);
  return (bool)(catalogFile._23_1_ & 1);
}

Assistant:

bool DynamicProfileStorage::LoadCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    DynamicProfileStorageReaderWriter catalogFile;
    DWORD magic;
    DWORD version;
    DWORD count;
    DWORD time;
    if (!catalogFile.Init(catalogFilename, _u("rb"), false))
    {
        return CreateCacheCatalog();
    }
    if (!catalogFile.Read(&magic)
        || !catalogFile.Read(&version)
        || !catalogFile.Read(&time)
        || !catalogFile.Read(&count)
        || magic != MagicNumber
        || version < FileFormatVersion)
    {
        catalogFile.Close();
#if DBG_DUMP
        if (DynamicProfileStorage::DoTrace())
        {
            Output::Print(_u("TRACE: DynamicProfileStorage: Overwriting file for cache directory catalog: '%s'\n"), catalogFilename);
            Output::Flush();
        }
#endif
        return CreateCacheCatalog();
    }

    if (version > FileFormatVersion)
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Existing cache catalog has a newer format.\n"));
        Output::Flush();
        return false;
    }

    DWORD start = 0;

    AssertOrFailFast(useCacheDir);
    if (time == creationTime)
    {
        // We can reuse existing data
        start = infoMap.Count();
        AssertOrFailFast(count >= start);
        AssertOrFailFast(catalogFile.Size() >= lastOffset);
        if (count == nextFileId)
        {
            AssertOrFailFast(catalogFile.Size() == lastOffset);
            return true;
        }

        if (!catalogFile.Seek(lastOffset))
        {
            catalogFile.Close();
            Output::Print(_u("ERROR: DynamicProfileStorage: Unable to seek to last known offset\n"));
            Output::Flush();
            return CreateCacheCatalog();
        }
    }
    else if (creationTime != 0)
    {
        Output::Print(_u("WARNING: DynamicProfileStorage: Reloading full catalog\n"));
        Output::Flush();
    }

    for (DWORD i = start; i < count; i++)
    {
        DWORD len;
        char16 * url;
        if (!catalogFile.ReadUtf8String(&url, &len))
        {
#if DBG_DUMP
            if (DynamicProfileStorage::DoTrace())
            {
                Output::Print(_u("TRACE: DynamicProfileStorage: Cache dir catalog file corrupted: '%s'\n"), catalogFilename);
                Output::Flush();
            }
#endif
            // REVIEW: the file is corrupted, should we not flush the cache totally?
            catalogFile.Close();
            return CreateCacheCatalog();
        }

        StorageInfo * oldInfo;
        if (infoMap.TryGetReference(url, &oldInfo))
        {
            AssertOrFailFast(oldInfo->isFileStorage);
            oldInfo->fileId = i;
        }
        else
        {
            StorageInfo newInfo;
            newInfo.isFileStorage = true;
            newInfo.fileId = i;
            infoMap.Add(url, newInfo);
        }
    }

#if DBG_DUMP
    if (creationTime == 0 && DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog loaded: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif

    nextFileId = count;
    creationTime = time;
    lastOffset = catalogFile.Size();
    return true;
}